

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls.c
# Opt level: O2

void al_set_blend_color(ALLEGRO_COLOR color)

{
  thread_local_state *ptVar1;
  float local_28;
  float fStack_24;
  
  ptVar1 = tls_get();
  if (ptVar1 != (thread_local_state *)0x0) {
    local_28 = color.r;
    fStack_24 = color.g;
    (ptVar1->current_blender).blend_color.r = local_28;
    (ptVar1->current_blender).blend_color.g = fStack_24;
    (ptVar1->current_blender).blend_color.b = color.b;
    (ptVar1->current_blender).blend_color.a = color.a;
  }
  return;
}

Assistant:

void al_set_blend_color(ALLEGRO_COLOR color)
{
   thread_local_state *tls;

   if ((tls = tls_get()) == NULL)
      return;

   tls->current_blender.blend_color = color;
}